

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_vprintf(ly_ctx *ctx,LY_LOG_LEVEL level,LY_ERR err,LY_VECODE vecode,char *data_path,
                char *schema_path,uint64_t line,char *apptag,char *format,__va_list_tag *args)

{
  undefined4 uVar1;
  bool bVar2;
  char *pcVar3;
  char *schema_path_00;
  char *data_path_00;
  LY_VECODE vecode_00;
  LY_VECODE level_00;
  ly_ctx *ctx_00;
  int iVar4;
  LY_ERR LVar5;
  long lVar6;
  char *local_a0;
  byte local_50;
  byte local_43;
  byte local_42;
  ly_bool lostore;
  ly_bool lolog;
  char *pcStack_40;
  ly_bool free_strs;
  char *msg;
  char *dyn_msg;
  char *schema_path_local;
  char *data_path_local;
  LY_ERR local_18;
  LY_VECODE vecode_local;
  LY_ERR err_local;
  LY_LOG_LEVEL level_local;
  ly_ctx *ctx_local;
  
  msg = (char *)0x0;
  bVar2 = true;
  dyn_msg = schema_path;
  schema_path_local = data_path;
  data_path_local._4_4_ = vecode;
  local_18 = err;
  vecode_local = level;
  _err_local = ctx;
  lVar6 = __tls_get_addr(&PTR_00277fa0);
  if (*(long *)(lVar6 + 0x240) == 0) {
    local_50 = (byte)ly_log_opts;
    local_42 = local_50;
  }
  else {
    lVar6 = __tls_get_addr(&PTR_00277fa0);
    uVar1 = **(undefined4 **)(lVar6 + 0x240);
    lVar6 = __tls_get_addr(&PTR_00277fa0);
    local_50 = (byte)**(undefined4 **)(lVar6 + 0x240);
    local_42 = (byte)uVar1;
  }
  local_42 = local_42 & 1;
  local_43 = local_50 & 2;
  if (vecode_local <= ly_ll) {
    if (local_18 == LY_EMEM) {
      lVar6 = __tls_get_addr(&PTR_00277fa0);
      vsnprintf((char *)(lVar6 + 0x40),0x200,format,args);
      lVar6 = __tls_get_addr(&PTR_00277fa0);
      pcStack_40 = (char *)(lVar6 + 0x40);
    }
    else {
      iVar4 = vasprintf(&msg,format,args);
      pcVar3 = msg;
      if (iVar4 == -1) {
        ly_log(_err_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","log_vprintf");
        goto LAB_00111dd2;
      }
      pcStack_40 = msg;
      lVar6 = __tls_get_addr(&PTR_00277fa0);
      strncpy((char *)(lVar6 + 0x40),pcVar3,0x1ff);
    }
    ctx_00 = _err_local;
    level_00 = vecode_local;
    LVar5 = local_18;
    vecode_00 = data_path_local._4_4_;
    data_path_00 = schema_path_local;
    schema_path_00 = dyn_msg;
    pcVar3 = msg;
    if ((((vecode_local < LYVE_SYNTAX_YANG) && (_err_local != (ly_ctx *)0x0)) && (local_43 != 0)) &&
       (msg != (char *)0x0)) {
      bVar2 = false;
      if (apptag == (char *)0x0) {
        local_a0 = (char *)0x0;
      }
      else {
        local_a0 = strdup(apptag);
      }
      LVar5 = log_store(ctx_00,level_00,LVar5,vecode_00,pcVar3,data_path_00,schema_path_00,line,
                        local_a0);
      if (LVar5 != LY_SUCCESS) goto LAB_00111dd2;
    }
    if (local_42 != 0) {
      if (log_clb == (ly_log_clb)0x0) {
        fprintf(_stderr,"libyang[%d]: ",(ulong)vecode_local);
        fprintf(_stderr,"%s",pcStack_40);
        log_stderr_path_line(schema_path_local,dyn_msg,line);
      }
      else {
        (*log_clb)(vecode_local,pcStack_40,schema_path_local,dyn_msg,line);
      }
    }
  }
LAB_00111dd2:
  if (bVar2) {
    free(schema_path_local);
    free(dyn_msg);
    free(msg);
  }
  return;
}

Assistant:

static void
log_vprintf(const struct ly_ctx *ctx, LY_LOG_LEVEL level, LY_ERR err, LY_VECODE vecode, char *data_path,
        char *schema_path, uint64_t line, const char *apptag, const char *format, va_list args)
{
    char *dyn_msg = NULL;
    const char *msg;
    ly_bool free_strs = 1, lolog, lostore;

    /* learn effective logger options */
    if (temp_ly_log_opts) {
        lolog = *temp_ly_log_opts & LY_LOLOG;
        lostore = *temp_ly_log_opts & LY_LOSTORE;
    } else {
        lolog = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOLOG;
        lostore = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOSTORE;
    }

    if (level > ATOMIC_LOAD_RELAXED(ly_ll)) {
        /* do not print or store the message */
        goto cleanup;
    }

    if (err == LY_EMEM) {
        /* no not use more dynamic memory */
        vsnprintf(last_msg, LY_LAST_MSG_SIZE, format, args);
        msg = last_msg;
    } else {
        /* print into a single message */
        if (vasprintf(&dyn_msg, format, args) == -1) {
            LOGMEM(ctx);
            goto cleanup;
        }
        msg = dyn_msg;

        /* store as the last message */
        strncpy(last_msg, msg, LY_LAST_MSG_SIZE - 1);
    }

    /* store the error/warning in the context (if we need to store errors internally, it does not matter what are
     * the user log options), if the message is not dynamic, it would most likely fail to store (no memory) */
    if ((level < LY_LLVRB) && ctx && lostore && dyn_msg) {
        free_strs = 0;
        if (log_store(ctx, level, err, vecode, dyn_msg, data_path, schema_path, line, apptag ? strdup(apptag) : NULL)) {
            goto cleanup;
        }
    }

    /* if we are only storing errors internally, never print the message (yet) */
    if (lolog) {
        if (log_clb) {
            log_clb(level, msg, data_path, schema_path, line);
        } else {
            fprintf(stderr, "libyang[%d]: ", level);
            fprintf(stderr, "%s", msg);
            log_stderr_path_line(data_path, schema_path, line);
        }
    }

cleanup:
    if (free_strs) {
        free(data_path);
        free(schema_path);
        free(dyn_msg);
    }
}